

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::generateArguments
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,
          ExpressionList *operands,Literals *arguments)

{
  Expression *curr;
  bool bVar1;
  size_t reservedSize;
  Expression **ppEVar2;
  ExpressionRunner<wasm::ModuleRunner> *this_00;
  Literal *x;
  Expression *expression;
  Iterator __end2;
  Iterator __begin2;
  ExpressionList *__range2;
  Literals *arguments_local;
  ExpressionList *operands_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  Flow *flow;
  
  reservedSize = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                           (&operands->
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           );
  SmallVector<wasm::Literal,_1UL>::reserve
            (&arguments->super_SmallVector<wasm::Literal,_1UL>,reservedSize);
  join_0x00000010_0x00000000_ =
       ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                 (&operands->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  _expression = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                          (&operands->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
  while( true ) {
    bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
            operator!=((Iterator *)&__end2.index,(Iterator *)&expression);
    if (!bVar1) {
      Flow::Flow(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator*((Iterator *)&__end2.index);
    curr = *ppEVar2;
    this_00 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    visit(__return_storage_ptr__,this_00,curr);
    bVar1 = Flow::breaking(__return_storage_ptr__);
    if (bVar1) break;
    x = Flow::getSingleValue(__return_storage_ptr__);
    SmallVector<wasm::Literal,_1UL>::push_back(&arguments->super_SmallVector<wasm::Literal,_1UL>,x);
    Flow::~Flow(__return_storage_ptr__);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
              ((Iterator *)&__end2.index);
  }
  return __return_storage_ptr__;
}

Assistant:

Flow generateArguments(const ExpressionList& operands, Literals& arguments) {
    NOTE_ENTER_("generateArguments");
    arguments.reserve(operands.size());
    for (auto expression : operands) {
      Flow flow = self()->visit(expression);
      if (flow.breaking()) {
        return flow;
      }
      NOTE_EVAL1(flow.values);
      arguments.push_back(flow.getSingleValue());
    }
    return Flow();
  }